

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  InetAddr server_addr;
  HTTPServer http_server;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  InetAddr local_d0;
  HTTPServer local_c0;
  
  signal(2,HandleSignal);
  cube::net::InetAddr::InetAddr(&local_d0,0x2108);
  cube::http::HTTPServer::HTTPServer(&local_c0,&g_event_loop,&local_d0);
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_f8._M_unused._M_object = operator_new(0x10);
  *(code **)local_f8._M_unused._0_8_ = HelloHandler;
  pcStack_e0 = std::
               _Function_handler<void_(std::shared_ptr<cube::http::HTTPConnection>,_const_cube::http::HTTPRequest_&),_std::_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<cube::http::HTTPConnection>,_const_cube::http::HTTPRequest_&)>_>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(std::shared_ptr<cube::http::HTTPConnection>,_const_cube::http::HTTPRequest_&),_std::_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<cube::http::HTTPConnection>,_const_cube::http::HTTPRequest_&)>_>
             ::_M_manager;
  std::function<void_(std::shared_ptr<cube::http::HTTPConnection>,_const_cube::http::HTTPRequest_&)>
  ::operator=(&local_c0.m_request_callback,
              (function<void_(std::shared_ptr<cube::http::HTTPConnection>,_const_cube::http::HTTPRequest_&)>
               *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,3);
  }
  bVar1 = cube::http::HTTPServer::Start(&local_c0);
  if (bVar1) {
    cube::net::InetAddr::IpPort_abi_cxx11_((string *)&local_f8,&local_d0);
    printf("http server start succ, listen addr=%s\n",local_f8._M_unused._M_object);
    if ((code **)local_f8._M_unused._0_8_ != &local_e8) {
      operator_delete(local_f8._M_unused._M_object);
    }
    cube::net::EventLoop::Loop(&g_event_loop);
    cube::http::HTTPServer::~HTTPServer(&local_c0);
    return 0;
  }
  __assert_fail("http_server.Start()",
                "/workspace/llm4binary/github/license_c_cmakelists/yplusplus[P]cube/examples/http_svr/main.cpp"
                ,0x29,"int main()");
}

Assistant:

int main() {
    signal(SIGINT, HandleSignal);

    InetAddr server_addr(8456);
    HTTPServer http_server(&g_event_loop, server_addr);
    //http_server.SetKeepAlive(true);
    http_server.SetRequestCallback(std::bind(&HelloHandler, _1, _2));
    assert(http_server.Start());
    printf("http server start succ, listen addr=%s\n", server_addr.IpPort().c_str());

    g_event_loop.Loop();

    return 0;
}